

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void __thiscall
google::protobuf::Reflection::SwapFields
          (Reflection *this,Message *message1,Message *message2,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *fields)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  FieldDescriptor *field;
  long lVar3;
  _Base_ptr p_Var4;
  int iVar5;
  LogMessage *pLVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _Base_ptr p_Var7;
  Reflection *extraout_RDX;
  Reflection *extraout_RDX_00;
  _Rb_tree_header *p_Var8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  int oneof_index;
  set<int,_std::less<int>,_std::allocator<int>_> swapped_oneof;
  int local_dc;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *local_d8;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_d0;
  LogMessage local_a0;
  LogMessage local_68;
  
  if (message1 != message2) {
    local_d8 = fields;
    (*(message1->super_MessageLite)._vptr_MessageLite[0x15])(message1);
    if (extraout_RDX != this) {
      internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_FATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x2a7);
      pLVar6 = internal::LogMessage::operator<<
                         (&local_68,"CHECK failed: (message1->GetReflection()) == (this): ");
      pLVar6 = internal::LogMessage::operator<<(pLVar6,"First argument to SwapFields() (of type \"")
      ;
      iVar5 = (*(message1->super_MessageLite)._vptr_MessageLite[0x15])(message1);
      pLVar6 = internal::LogMessage::operator<<
                         (pLVar6,*(string **)(CONCAT44(extraout_var,iVar5) + 8));
      pLVar6 = internal::LogMessage::operator<<
                         (pLVar6,
                          "\") is not compatible with this reflection object (which is for type \"")
      ;
      pLVar6 = internal::LogMessage::operator<<(pLVar6,*(string **)(this->descriptor_ + 8));
      pLVar6 = internal::LogMessage::operator<<
                         (pLVar6,
                          "\").  Note that the exact same class is required; not just the same descriptor."
                         );
      internal::LogFinisher::operator=((LogFinisher *)&local_a0,pLVar6);
      internal::LogMessage::~LogMessage(&local_68);
    }
    (*(message2->super_MessageLite)._vptr_MessageLite[0x15])();
    if (extraout_RDX_00 != this) {
      internal::LogMessage::LogMessage
                (&local_a0,LOGLEVEL_FATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x2af);
      pLVar6 = internal::LogMessage::operator<<
                         (&local_a0,"CHECK failed: (message2->GetReflection()) == (this): ");
      pLVar6 = internal::LogMessage::operator<<
                         (pLVar6,"Second argument to SwapFields() (of type \"");
      iVar5 = (*(message2->super_MessageLite)._vptr_MessageLite[0x15])();
      pLVar6 = internal::LogMessage::operator<<
                         (pLVar6,*(string **)(CONCAT44(extraout_var_00,iVar5) + 8));
      pLVar6 = internal::LogMessage::operator<<
                         (pLVar6,
                          "\") is not compatible with this reflection object (which is for type \"")
      ;
      pLVar6 = internal::LogMessage::operator<<(pLVar6,*(string **)(this->descriptor_ + 8));
      pLVar6 = internal::LogMessage::operator<<
                         (pLVar6,
                          "\").  Note that the exact same class is required; not just the same descriptor."
                         );
      internal::LogFinisher::operator=((LogFinisher *)&local_d0,pLVar6);
      internal::LogMessage::~LogMessage(&local_a0);
    }
    p_Var1 = &local_d0._M_impl.super__Rb_tree_header;
    local_d0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_d0._M_impl.super__Rb_tree_header._M_node_count = 0;
    uVar9 = (uint)((ulong)((long)(local_d8->
                                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(local_d8->
                                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3);
    local_d0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_d0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    if (0 < (int)uVar9) {
      uVar11 = 0;
      do {
        field = (local_d8->
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                )._M_impl.super__Vector_impl_data._M_start[uVar11];
        if (field[0x42] == (FieldDescriptor)0x1) {
          uVar10 = (ulong)(uint)(this->schema_).extensions_offset_;
          internal::ExtensionSet::SwapExtension
                    ((ExtensionSet *)
                     ((long)&(message1->super_MessageLite)._vptr_MessageLite + uVar10),
                     (ExtensionSet *)
                     ((long)&(message2->super_MessageLite)._vptr_MessageLite + uVar10),
                     *(int *)(field + 0x44));
        }
        else {
          lVar3 = *(long *)(field + 0x58);
          if (lVar3 == 0) {
            if (*(int *)(field + 0x3c) != 3) {
              SwapBit(this,message1,message2,field);
            }
            SwapField(this,message1,message2,field);
          }
          else {
            iVar5 = (int)((ulong)(lVar3 - *(long *)(*(long *)(lVar3 + 0x10) + 0x30)) >> 4);
            local_dc = iVar5 * -0x55555555;
            p_Var7 = &p_Var1->_M_header;
            for (p_Var4 = local_d0._M_impl.super__Rb_tree_header._M_header._M_parent;
                (_Rb_tree_header *)p_Var4 != (_Rb_tree_header *)0x0;
                p_Var4 = (&p_Var4->_M_left)[iVar2 < local_dc]) {
              iVar2 = (int)*(size_t *)(p_Var4 + 1);
              if (SBORROW4(iVar2,local_dc) == iVar2 + iVar5 * 0x55555555 < 0) {
                p_Var7 = p_Var4;
              }
            }
            p_Var8 = p_Var1;
            if (((_Rb_tree_header *)p_Var7 != p_Var1) &&
               (p_Var8 = (_Rb_tree_header *)p_Var7,
               local_dc < (int)((_Rb_tree_header *)p_Var7)->_M_node_count)) {
              p_Var8 = p_Var1;
            }
            if (p_Var8 == p_Var1) {
              std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
              _M_insert_unique<int_const&>
                        ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *
                         )&local_d0,&local_dc);
              SwapOneofField(this,message1,message2,*(OneofDescriptor **)(field + 0x58));
            }
          }
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != (uVar9 & 0x7fffffff));
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&local_d0);
  }
  return;
}

Assistant:

void Reflection::SwapFields(
    Message* message1, Message* message2,
    const std::vector<const FieldDescriptor*>& fields) const {
  if (message1 == message2) return;

  // TODO(kenton):  Other Reflection methods should probably check this too.
  GOOGLE_CHECK_EQ(message1->GetReflection(), this)
      << "First argument to SwapFields() (of type \""
      << message1->GetDescriptor()->full_name()
      << "\") is not compatible with this reflection object (which is for type "
         "\""
      << descriptor_->full_name()
      << "\").  Note that the exact same class is required; not just the same "
         "descriptor.";
  GOOGLE_CHECK_EQ(message2->GetReflection(), this)
      << "Second argument to SwapFields() (of type \""
      << message2->GetDescriptor()->full_name()
      << "\") is not compatible with this reflection object (which is for type "
         "\""
      << descriptor_->full_name()
      << "\").  Note that the exact same class is required; not just the same "
         "descriptor.";

  std::set<int> swapped_oneof;

  const int fields_size = static_cast<int>(fields.size());
  for (int i = 0; i < fields_size; i++) {
    const FieldDescriptor* field = fields[i];
    if (field->is_extension()) {
      MutableExtensionSet(message1)->SwapExtension(
          MutableExtensionSet(message2), field->number());
    } else {
      if (field->containing_oneof()) {
        int oneof_index = field->containing_oneof()->index();
        // Only swap the oneof field once.
        if (swapped_oneof.find(oneof_index) != swapped_oneof.end()) {
          continue;
        }
        swapped_oneof.insert(oneof_index);
        SwapOneofField(message1, message2, field->containing_oneof());
      } else {
        // Swap has bit for non-repeated fields.  We have already checked for
        // oneof already.
        if (!field->is_repeated()) {
          SwapBit(message1, message2, field);
        }
        // Swap field.
        SwapField(message1, message2, field);
      }
    }
  }
}